

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_kmgmt.c
# Opt level: O0

void dsa_gen_cleanup(void *genctx)

{
  char *in_RDI;
  void *unaff_retaddr;
  dsa_gen_ctx *gctx;
  int in_stack_ffffffffffffffec;
  char *num;
  
  if (in_RDI != (char *)0x0) {
    num = in_RDI;
    CRYPTO_free(*(void **)(in_RDI + 0x48));
    CRYPTO_free(*(void **)(in_RDI + 0x50));
    CRYPTO_clear_free(unaff_retaddr,(size_t)num,in_RDI,in_stack_ffffffffffffffec);
    CRYPTO_free(in_RDI);
  }
  return;
}

Assistant:

static void dsa_gen_cleanup(void *genctx)
{
    struct dsa_gen_ctx *gctx = genctx;

    if (gctx == NULL)
        return;

    OPENSSL_free(gctx->mdname);
    OPENSSL_free(gctx->mdprops);
    OPENSSL_clear_free(gctx->seed, gctx->seedlen);
    OPENSSL_free(gctx);
}